

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

void __thiscall
duckdb::BitStringAggOperation::
Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
          (BitStringAggOperation *this,BitAggState<duckdb::hugeint_t> *state,hugeint_t *input,
          AggregateUnaryInput *unary_input)

{
  optional_ptr<duckdb::FunctionData,_true> *this_00;
  FunctionData *pFVar1;
  bool bVar2;
  idx_t len;
  idx_t iVar3;
  void *__src;
  OutOfRangeException *pOVar4;
  BinderException *this_01;
  InvalidInputException *this_02;
  hugeint_t hVar5;
  hugeint_t hVar6;
  hugeint_t value;
  hugeint_t value_00;
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  anon_union_16_2_67f50693_for_value local_130;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (optional_ptr<duckdb::FunctionData,_true> *)input->lower;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(this_00);
  pFVar1 = this_00->ptr;
  if (*this == (BitStringAggOperation)0x0) {
    if ((*(char *)&pFVar1[4]._vptr_FunctionData != '\0') ||
       (*(char *)&pFVar1[0xc]._vptr_FunctionData == '\x01')) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,"");
      BinderException::BinderException(this_01,(string *)&local_130.pointer);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    hVar5 = Value::GetValue<duckdb::hugeint_t>((Value *)(pFVar1 + 1));
    *(hugeint_t *)(this + 0x18) = hVar5;
    hVar5 = Value::GetValue<duckdb::hugeint_t>((Value *)(pFVar1 + 9));
    *(hugeint_t *)(this + 0x28) = hVar5;
    bVar2 = hugeint_t::operator>((hugeint_t *)(this + 0x18),(hugeint_t *)(this + 0x28));
    if (bVar2) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)","");
      hVar5.upper = (int64_t)unary_input;
      hVar5.lower = *(uint64_t *)(this + 0x20);
      NumericHelper::ToString<duckdb::hugeint_t>(&local_50,*(NumericHelper **)(this + 0x18),hVar5);
      hVar6.upper = (int64_t)unary_input;
      hVar6.lower = *(uint64_t *)(this + 0x30);
      NumericHelper::ToString<duckdb::hugeint_t>(&local_70,*(NumericHelper **)(this + 0x28),hVar6);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_02,(string *)&local_130.pointer,&local_50,&local_70);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    hVar5 = Value::GetValue<duckdb::hugeint_t>((Value *)(pFVar1 + 1));
    hVar6 = Value::GetValue<duckdb::hugeint_t>((Value *)(pFVar1 + 9));
    unary_input = (AggregateUnaryInput *)hVar6.upper;
    len = GetRange<duckdb::hugeint_t>(hVar5,hVar6);
    if (1000000000 < len) {
      pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,"");
      value_02.upper = (int64_t)unary_input;
      value_02.lower = *(uint64_t *)(this + 0x20);
      NumericHelper::ToString<duckdb::hugeint_t>
                (&local_90,*(NumericHelper **)(this + 0x18),value_02);
      value_03.upper = (int64_t)unary_input;
      value_03.lower = *(uint64_t *)(this + 0x30);
      NumericHelper::ToString<duckdb::hugeint_t>
                (&local_b0,*(NumericHelper **)(this + 0x28),value_03);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar4,(string *)&local_130.pointer,&local_90,&local_b0);
      __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = Bit::ComputeBitstringLen(len);
    local_130.pointer.length = (uint32_t)iVar3;
    if (0xc < iVar3) {
      __src = operator_new__(iVar3);
      if (local_130.pointer.length < 0xd) {
        local_130._12_4_ = 0;
        local_130.pointer.prefix[0] = '\0';
        local_130.pointer.prefix[1] = '\0';
        local_130.pointer.prefix[2] = '\0';
        local_130.pointer.prefix[3] = '\0';
        local_130._8_4_ = 0;
        if (local_130.pointer.length != 0) {
          switchD_012b9b0d::default
                    (local_130.pointer.prefix,__src,(ulong)(local_130.pointer.length & 0xf));
        }
      }
      else {
        local_130._8_4_ = SUB84(__src,0);
        local_130._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    Bit::SetEmptyBitString((bitstring_t *)&local_130.pointer,len);
    *(ulong *)(this + 8) = CONCAT44(local_130.pointer.prefix,local_130.pointer.length);
    *(ulong *)(this + 0x10) = CONCAT44(local_130._12_4_,local_130._8_4_);
    *this = (BitStringAggOperation)0x1;
  }
  bVar2 = hugeint_t::operator>=((hugeint_t *)state,(hugeint_t *)(this + 0x18));
  if ((bVar2) &&
     (bVar2 = hugeint_t::operator<=((hugeint_t *)state,(hugeint_t *)(this + 0x28)), bVar2)) {
    hVar5 = *(hugeint_t *)state;
    hVar6 = Value::GetValue<duckdb::hugeint_t>((Value *)(pFVar1 + 1));
    Execute<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>>
              ((BitAggState<duckdb::hugeint_t> *)this,hVar5,hVar6);
    return;
  }
  pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_130._0_8_ = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Value %s is outside of provided min and max range (%s <-> %s)",""
            );
  value.upper = (int64_t)unary_input;
  value.lower = *(uint64_t *)&(state->value).value;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_d0,*(NumericHelper **)state,value);
  value_00.upper = (int64_t)unary_input;
  value_00.lower = *(uint64_t *)(this + 0x20);
  NumericHelper::ToString<duckdb::hugeint_t>(&local_f0,*(NumericHelper **)(this + 0x18),value_00);
  value_01.upper = (int64_t)unary_input;
  value_01.lower = *(uint64_t *)(this + 0x30);
  NumericHelper::ToString<duckdb::hugeint_t>(&local_110,*(NumericHelper **)(this + 0x28),value_01);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar4,(string *)&local_130.pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}